

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall
smf::Option_register::Option_register
          (Option_register *this,string *aDefinition,char aType,string *aDefaultOption)

{
  (this->m_definition)._M_dataplus._M_p = (pointer)&(this->m_definition).field_2;
  (this->m_definition)._M_string_length = 0;
  (this->m_definition).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_defaultOption)._M_dataplus._M_p = (pointer)&(this->m_defaultOption).field_2;
  (this->m_defaultOption)._M_string_length = 0;
  (this->m_defaultOption).field_2._M_local_buf[0] = '\0';
  (this->m_modifiedOption)._M_dataplus._M_p = (pointer)&(this->m_modifiedOption).field_2;
  (this->m_modifiedOption)._M_string_length = 0;
  (this->m_modifiedOption).field_2._M_local_buf[0] = '\0';
  this->m_modifiedQ = false;
  this->m_type = aType;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->m_defaultOption);
  return;
}

Assistant:

Option_register::Option_register(const std::string& aDefinition, char aType,
		const std::string& aDefaultOption) {
	m_modifiedQ = false;
	setType(aType);
	setDefinition(aDefinition);
	setDefault(aDefaultOption);
}